

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int rsa2_pubkey_bits(ssh_keyalg *self,ptrlen pub)

{
  ssh_key *key;
  size_t sVar1;
  int ret;
  RSAKey *rsa;
  ssh_key *sshk;
  ssh_keyalg *self_local;
  ptrlen pub_local;
  
  key = rsa2_new_pub(self,pub);
  if (key == (ssh_key *)0x0) {
    pub_local.len._4_4_ = -1;
  }
  else {
    sVar1 = mp_get_nbits((mp_int *)key[-7].vt);
    pub_local.len._4_4_ = (int)sVar1;
    rsa2_freekey(key);
  }
  return pub_local.len._4_4_;
}

Assistant:

static int rsa2_pubkey_bits(const ssh_keyalg *self, ptrlen pub)
{
    ssh_key *sshk;
    RSAKey *rsa;
    int ret;

    sshk = rsa2_new_pub(self, pub);
    if (!sshk)
        return -1;

    rsa = container_of(sshk, RSAKey, sshk);
    ret = mp_get_nbits(rsa->modulus);
    rsa2_freekey(&rsa->sshk);

    return ret;
}